

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_copyBlockSequences
                 (SeqCollector *seqCollector,seqStore_t *seqStore,U32 *prevRepcodes)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  seqDef *psVar4;
  size_t sVar5;
  ZSTD_Sequence *pZVar6;
  size_t sVar7;
  uint uVar8;
  U32 UVar9;
  int iVar10;
  long lVar11;
  uint *puVar12;
  U32 UVar13;
  ulong uVar14;
  uint uVar15;
  U32 UVar16;
  undefined8 local_68;
  U32 local_60;
  BYTE *local_58;
  BYTE *local_50;
  SeqCollector *local_48;
  ulong local_40;
  repcodes_t repcodes;
  
  psVar4 = seqStore->sequencesStart;
  lVar11 = (long)seqStore->sequences - (long)psVar4 >> 3;
  sVar5 = seqCollector->seqIndex;
  local_40 = lVar11 + 1;
  sVar7 = 0xffffffffffffffba;
  if (local_40 <= seqCollector->maxSequences - sVar5) {
    local_50 = seqStore->lit;
    local_58 = seqStore->litStart;
    local_48 = seqCollector;
    pZVar6 = seqCollector->seqStart;
    repcodes.rep[0] = (int)sVar5;
    repcodes.rep[1] = (int)(sVar5 >> 0x20);
    local_60 = prevRepcodes[2];
    local_68 = *(undefined8 *)prevRepcodes;
    if (seqStore->sequences == psVar4) {
      iVar10 = 0;
    }
    else {
      local_68._4_4_ = (U32)((ulong)local_68 >> 0x20);
      uVar3 = seqStore->longLengthPos;
      puVar12 = &pZVar6[sVar5].rep;
      iVar10 = 0;
      uVar14 = 0;
      UVar13 = (U32)local_68;
      UVar16 = local_68._4_4_;
      do {
        uVar1 = psVar4[uVar14].litLength;
        puVar12[-2] = (uint)uVar1;
        uVar2 = psVar4[uVar14].mlBase;
        puVar12[-1] = uVar2 + 3;
        *puVar12 = 0;
        if (uVar3 == uVar14) {
          if (seqStore->longLengthType == ZSTD_llt_matchLength) {
            puVar12[-1] = uVar2 + 0x10003;
          }
          else if (seqStore->longLengthType == ZSTD_llt_literalLength) {
            puVar12[-2] = uVar1 + 0x10000;
          }
        }
        uVar15 = psVar4[uVar14].offBase;
        if (uVar15 - 1 < 3) {
          *puVar12 = uVar15;
          if (puVar12[-2] == 0) {
            if (uVar15 == 3) {
              uVar8 = UVar13 - 1;
            }
            else {
              uVar8 = *(uint *)((long)&local_68 + (ulong)uVar15 * 4);
            }
          }
          else {
            uVar8 = *(uint *)((long)&local_68 + (ulong)(uVar15 - 1) * 4);
          }
        }
        else {
          uVar8 = uVar15 - 3;
        }
        ((ZSTD_Sequence *)(puVar12 + -3))->offset = uVar8;
        if (uVar15 < 4) {
          uVar15 = uVar15 - (uVar1 != 0);
          UVar9 = UVar13;
          if (uVar15 != 0) {
            if (uVar15 == 3) {
              UVar9 = UVar13 - 1;
            }
            else {
              UVar9 = *(U32 *)((long)&local_68 + (ulong)uVar15 * 4);
            }
            if (uVar15 == 1) {
              UVar16 = local_60;
            }
            local_60 = UVar16;
            local_68 = CONCAT44(UVar13,UVar9);
            UVar16 = UVar13;
          }
        }
        else {
          local_60 = UVar16;
          local_68 = CONCAT44(UVar13,uVar15 - 3);
          UVar9 = uVar15 - 3;
          UVar16 = UVar13;
        }
        UVar13 = UVar9;
        iVar10 = iVar10 + puVar12[-2];
        uVar14 = uVar14 + 1;
        puVar12 = puVar12 + 4;
      } while (lVar11 + (ulong)(lVar11 == 0) != uVar14);
    }
    pZVar6[sVar5 + lVar11].litLength = (int)local_50 - (iVar10 + (int)local_58);
    sVar7 = 0;
    pZVar6[sVar5 + lVar11].matchLength = 0;
    pZVar6[sVar5 + lVar11].offset = 0;
    seqCollector->seqIndex = local_40 + sVar5;
  }
  return sVar7;
}

Assistant:

static size_t ZSTD_copyBlockSequences(SeqCollector* seqCollector, const seqStore_t* seqStore, const U32 prevRepcodes[ZSTD_REP_NUM])
{
    const seqDef* inSeqs = seqStore->sequencesStart;
    const size_t nbInSequences = seqStore->sequences - inSeqs;
    const size_t nbInLiterals = (size_t)(seqStore->lit - seqStore->litStart);

    ZSTD_Sequence* outSeqs = seqCollector->seqIndex == 0 ? seqCollector->seqStart : seqCollector->seqStart + seqCollector->seqIndex;
    const size_t nbOutSequences = nbInSequences + 1;
    size_t nbOutLiterals = 0;
    repcodes_t repcodes;
    size_t i;

    /* Bounds check that we have enough space for every input sequence
     * and the block delimiter
     */
    assert(seqCollector->seqIndex <= seqCollector->maxSequences);
    RETURN_ERROR_IF(
        nbOutSequences > (size_t)(seqCollector->maxSequences - seqCollector->seqIndex),
        dstSize_tooSmall,
        "Not enough space to copy sequences");

    ZSTD_memcpy(&repcodes, prevRepcodes, sizeof(repcodes));
    for (i = 0; i < nbInSequences; ++i) {
        U32 rawOffset;
        outSeqs[i].litLength = inSeqs[i].litLength;
        outSeqs[i].matchLength = inSeqs[i].mlBase + MINMATCH;
        outSeqs[i].rep = 0;

        /* Handle the possible single length >= 64K
         * There can only be one because we add MINMATCH to every match length,
         * and blocks are at most 128K.
         */
        if (i == seqStore->longLengthPos) {
            if (seqStore->longLengthType == ZSTD_llt_literalLength) {
                outSeqs[i].litLength += 0x10000;
            } else if (seqStore->longLengthType == ZSTD_llt_matchLength) {
                outSeqs[i].matchLength += 0x10000;
            }
        }

        /* Determine the raw offset given the offBase, which may be a repcode. */
        if (OFFBASE_IS_REPCODE(inSeqs[i].offBase)) {
            const U32 repcode = OFFBASE_TO_REPCODE(inSeqs[i].offBase);
            assert(repcode > 0);
            outSeqs[i].rep = repcode;
            if (outSeqs[i].litLength != 0) {
                rawOffset = repcodes.rep[repcode - 1];
            } else {
                if (repcode == 3) {
                    assert(repcodes.rep[0] > 1);
                    rawOffset = repcodes.rep[0] - 1;
                } else {
                    rawOffset = repcodes.rep[repcode];
                }
            }
        } else {
            rawOffset = OFFBASE_TO_OFFSET(inSeqs[i].offBase);
        }
        outSeqs[i].offset = rawOffset;

        /* Update repcode history for the sequence */
        ZSTD_updateRep(repcodes.rep,
                       inSeqs[i].offBase,
                       inSeqs[i].litLength == 0);

        nbOutLiterals += outSeqs[i].litLength;
    }
    /* Insert last literals (if any exist) in the block as a sequence with ml == off == 0.
     * If there are no last literals, then we'll emit (of: 0, ml: 0, ll: 0), which is a marker
     * for the block boundary, according to the API.
     */
    assert(nbInLiterals >= nbOutLiterals);
    {
        const size_t lastLLSize = nbInLiterals - nbOutLiterals;
        outSeqs[nbInSequences].litLength = (U32)lastLLSize;
        outSeqs[nbInSequences].matchLength = 0;
        outSeqs[nbInSequences].offset = 0;
        assert(nbOutSequences == nbInSequences + 1);
    }
    seqCollector->seqIndex += nbOutSequences;
    assert(seqCollector->seqIndex <= seqCollector->maxSequences);

    return 0;
}